

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O2

void __thiscall
xemmai::t_value<xemmai::t_pointer>::f_put
          (t_value<xemmai::t_pointer> *this,t_object *a_key,size_t *a_index,
          t_value<xemmai::t_pointer> *a_value)

{
  t_object *a_this;
  
  a_this = f_object_or_throw(this);
  t_type_of<xemmai::t_object>::f_put(a_this->v_type,a_this,a_key,a_index,a_value);
  return;
}

Assistant:

void f_put(t_object* a_key, size_t& a_index, const t_value<t_pointer>& a_value) const
	{
		auto p = f_object_or_throw();
		p->f_type()->f_put(p, a_key, a_index, a_value);
	}